

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O1

void wr_chunks(void)

{
  chunk *c;
  ulong uVar1;
  ulong uVar2;
  
  if (player->is_dead == false) {
    wr_u16b(chunk_list_max);
    if (chunk_list_max != 0) {
      uVar1 = 0;
      do {
        c = (chunk *)chunk_list[uVar1];
        wr_dungeon_aux(c);
        wr_objects_aux(c);
        wr_monsters_aux(c);
        wr_traps_aux(c);
        if ((player->opts).opt[0x2a] == true) {
          wr_string(c->name);
          wr_s32b(c->turn);
          wr_u16b((uint16_t)c->depth);
          wr_byte(c->feeling);
          wr_u32b(c->obj_rating);
          wr_u32b(c->mon_rating);
          wr_byte(c->good_item);
          wr_u16b((uint16_t)c->height);
          wr_u16b((uint16_t)c->width);
          wr_u16b(c->feeling_squares);
          uVar2 = 0xffffffffffffffff;
          do {
            wr_u16b(*(uint16_t *)(c->feat_count + uVar2 + 1));
            uVar2 = uVar2 + 1;
          } while (uVar2 < z_info->f_max);
          wr_byte((uint8_t)c->ghost->bones_selector);
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < chunk_list_max);
    }
  }
  return;
}

Assistant:

void wr_chunks(void)
{
	int j;

	if (player->is_dead)
		return;

	wr_u16b(chunk_list_max);

	/* Now write each chunk */
	for (j = 0; j < chunk_list_max; j++) {
		struct chunk *c = chunk_list[j];

		/* Write the terrain and info */
		wr_dungeon_aux(c);

		/* Write the objects */
		wr_objects_aux(c);

		/* Write the monsters */
		wr_monsters_aux(c);

		/* Write the traps */
		wr_traps_aux(c);

		/* Write other chunk info */
		if (OPT(player, birth_levels_persist)) {
			int i;

			wr_string(c->name);
			wr_s32b(c->turn);
			wr_u16b(c->depth);
			wr_byte(c->feeling);
			wr_u32b(c->obj_rating);
			wr_u32b(c->mon_rating);
			wr_byte(c->good_item ? 1 : 0);
			wr_u16b(c->height);
			wr_u16b(c->width);
			wr_u16b(c->feeling_squares);
			for (i = 0; i < z_info->f_max + 1; i++) {
				wr_u16b(c->feat_count[i]);
			}
			wr_byte(c->ghost->bones_selector);
		}
	}
}